

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall sentencepiece::SentencePieceText::Clear(SentencePieceText *this)

{
  undefined8 *puVar1;
  
  google::protobuf::internal::ExtensionSet::Clear(&this->_extensions_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::TypeHandler>
            (&(this->pieces_).super_RepeatedPtrFieldBase);
  if (((this->_has_bits_).has_bits_[0] & 1) != 0) {
    puVar1 = (undefined8 *)((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
    puVar1[1] = 0;
    *(undefined1 *)*puVar1 = 0;
  }
  this->score_ = 0.0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void SentencePieceText::Clear() {
// @@protoc_insertion_point(message_clear_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  pieces_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    text_.ClearNonDefaultToEmpty();
  }
  score_ = 0;
  _has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}